

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * __thiscall QDir::absolutePath(QDir *this)

{
  bool bVar1;
  pointer pQVar2;
  QString *in_RDI;
  QDirPrivate *d;
  QDirPrivate *in_stack_00000020;
  
  d_func((QDir *)0x27d298);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x27d2ab);
  if (bVar1) {
    pQVar2 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x27d2cd);
    (*pQVar2->_vptr_QAbstractFileEngine[0x19])(in_RDI,pQVar2,3);
  }
  else {
    QDirPrivate::resolveAbsoluteEntry(in_stack_00000020);
  }
  return in_RDI;
}

Assistant:

QString QDir::absolutePath() const
{
    Q_D(const QDir);
    if (!d->fileEngine)
        return d->resolveAbsoluteEntry();

    return d->fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
}